

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O0

KeyboardMapping * Tunings::readKBMStream(KeyboardMapping *__return_storage_ptr__,istream *inf)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  char *pcVar4;
  long lVar5;
  ostream *poVar6;
  TuningError *pTVar7;
  size_type sVar8;
  double dVar9;
  string local_5b8 [39];
  undefined1 local_591;
  __cxx11 local_590 [32];
  __cxx11 local_570 [32];
  char local_550 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0 [39];
  undefined1 local_4c9;
  string local_4c8 [32];
  ostringstream local_4a8 [8];
  ostringstream oss;
  double v;
  int i;
  __cxx11 local_300 [32];
  char local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [38];
  char local_1da;
  byte local_1d9;
  char badChar;
  char *pcStack_1d8;
  bool validLine;
  char *lc;
  int lineno;
  parsePosition state;
  ostringstream rawOSS;
  string local_38 [8];
  string line;
  istream *inf_local;
  KeyboardMapping *res;
  
  std::__cxx11::string::string(local_38);
  KeyboardMapping::KeyboardMapping(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&lineno);
  std::vector<int,_std::allocator<int>_>::clear(&__return_storage_ptr__->keys);
  lc._4_4_ = 0;
  lc._0_4_ = 0;
  do {
    do {
      piVar3 = getlineEndingIndependent(inf,(string *)local_38);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) {
        if ((lc._4_4_ != 7) && (lc._4_4_ != 8)) {
          std::__cxx11::ostringstream::ostringstream(local_4a8);
          poVar6 = std::operator<<((ostream *)local_4a8,"Incomplete KBM stream. Only able to read ")
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lc);
          std::operator<<(poVar6," lines. Read up to ");
          switch(lc._4_4_) {
          case 0:
            std::operator<<((ostream *)local_4a8,"map size.");
            break;
          case 1:
            std::operator<<((ostream *)local_4a8,"first midi note.");
            break;
          case 2:
            std::operator<<((ostream *)local_4a8,"last midi note.");
            break;
          case 3:
            std::operator<<((ostream *)local_4a8,"scale zero note.");
            break;
          case 4:
            std::operator<<((ostream *)local_4a8,"scale reference note.");
            break;
          case 5:
            std::operator<<((ostream *)local_4a8,"scale reference frequency.");
            break;
          case 6:
            std::operator<<((ostream *)local_4a8,"scale degree.");
            break;
          default:
            std::operator<<((ostream *)local_4a8,"unknown state");
          }
          local_4c9 = 1;
          pTVar7 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          TuningError::TuningError(pTVar7,local_4c8);
          local_4c9 = 0;
          __cxa_throw(pTVar7,&TuningError::typeinfo,TuningError::~TuningError);
        }
        sVar8 = std::vector<int,_std::allocator<int>_>::size(&__return_storage_ptr__->keys);
        if ((int)sVar8 != __return_storage_ptr__->count) {
          local_591 = 1;
          pTVar7 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(local_570,__return_storage_ptr__->count);
          std::operator+(local_550,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Different number of keys than mapping file indicates. Count is ");
          std::operator+(local_530,local_550);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&__return_storage_ptr__->keys);
          std::__cxx11::to_string(local_590,sVar8);
          std::operator+(local_510,local_530);
          std::operator+(local_4f0,(char *)local_510);
          TuningError::TuningError(pTVar7,local_4f0);
          local_591 = 0;
          __cxa_throw(pTVar7,&TuningError::typeinfo,TuningError::~TuningError);
        }
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->rawText,local_5b8);
        std::__cxx11::string::~string(local_5b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lineno);
        std::__cxx11::string::~string(local_38);
        return __return_storage_ptr__;
      }
      poVar6 = std::operator<<((ostream *)&lineno,local_38);
      std::operator<<(poVar6,"\n");
      lc._0_4_ = (int)lc + 1;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    } while (*pcVar4 == '!');
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"x");
    if (bVar1) {
      std::__cxx11::string::operator=(local_38,"-1");
    }
    else if (lc._4_4_ != 8) {
      pcStack_1d8 = (char *)std::__cxx11::string::c_str();
      lVar5 = std::__cxx11::string::length();
      local_1d9 = lVar5 != 0;
      local_1da = '\0';
      while( true ) {
        bVar1 = false;
        if ((local_1d9 & 1) != 0) {
          bVar1 = *pcStack_1d8 != '\0';
        }
        if (!bVar1) break;
        if ((((*pcStack_1d8 != ' ') && (iVar2 = isdigit((int)*pcStack_1d8), iVar2 == 0)) &&
            (*pcStack_1d8 != '.')) && ((*pcStack_1d8 != '\r' && (*pcStack_1d8 != '\n')))) {
          local_1d9 = 0;
          local_1da = *pcStack_1d8;
        }
        pcStack_1d8 = pcStack_1d8 + 1;
      }
      if ((local_1d9 & 1) == 0) {
        v._7_1_ = 1;
        pTVar7 = (TuningError *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(local_300,(int)lc);
        std::operator+(local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Invalid line ");
        std::operator+(local_2c0,local_2e0);
        std::operator+(local_2a0,local_2c0);
        std::operator+(local_280,(char *)local_2a0);
        std::operator+(local_260,(char)local_280);
        std::operator+(local_240,(char *)local_260);
        std::__cxx11::to_string((__cxx11 *)&i,(int)local_1da);
        std::operator+(local_220,local_240);
        std::operator+(local_200,(char *)local_220);
        TuningError::TuningError(pTVar7,local_200);
        v._7_1_ = 0;
        __cxa_throw(pTVar7,&TuningError::typeinfo,TuningError::~TuningError);
      }
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    v._0_4_ = atoi(pcVar4);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    dVar9 = locale_atof(pcVar4);
    switch(lc._4_4_) {
    case 0:
      __return_storage_ptr__->count = v._0_4_;
      break;
    case 1:
      __return_storage_ptr__->firstMidi = v._0_4_;
      break;
    case 2:
      __return_storage_ptr__->lastMidi = v._0_4_;
      break;
    case 3:
      __return_storage_ptr__->middleNote = v._0_4_;
      break;
    case 4:
      __return_storage_ptr__->tuningConstantNote = v._0_4_;
      break;
    case 5:
      __return_storage_ptr__->tuningFrequency = dVar9;
      __return_storage_ptr__->tuningPitch =
           __return_storage_ptr__->tuningFrequency / 8.17579891564371;
      break;
    case 6:
      __return_storage_ptr__->octaveDegrees = v._0_4_;
      break;
    case 7:
      std::vector<int,_std::allocator<int>_>::push_back
                (&__return_storage_ptr__->keys,(value_type_conflict *)&v);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&__return_storage_ptr__->keys);
      if ((int)sVar8 == __return_storage_ptr__->count) {
        lc._4_4_ = 8;
      }
      break;
    case 8:
    }
    if ((lc._4_4_ != 7) && (lc._4_4_ != 8)) {
      lc._4_4_ = lc._4_4_ + 1;
    }
    if ((lc._4_4_ == 7) && (__return_storage_ptr__->count == 0)) {
      lc._4_4_ = 8;
    }
  } while( true );
}

Assistant:

inline KeyboardMapping readKBMStream(std::istream &inf)
{
    std::string line;

    KeyboardMapping res;
    std::ostringstream rawOSS;
    res.keys.clear();

    enum parsePosition
    {
        map_size = 0,
        first_midi,
        last_midi,
        middle,
        reference,
        freq,
        degree,
        keys,
        trailing
    };
    parsePosition state = map_size;

    int lineno = 0;
    while (getlineEndingIndependent(inf, line))
    {
        rawOSS << line << "\n";
        lineno++;
        if (line[0] == '!')
        {
            continue;
        }

        if (line == "x")
            line = "-1";
        else if (state != trailing)
        {
            const char *lc = line.c_str();
            bool validLine = line.length() > 0;
            char badChar = '\0';
            while (validLine && *lc != '\0')
            {
                if (!(*lc == ' ' || std::isdigit(*lc) || *lc == '.' || *lc == (char)13 ||
                      *lc == '\n'))
                {
                    validLine = false;
                    badChar = *lc;
                }
                lc++;
            }
            if (!validLine)
            {
                throw TuningError("Invalid line " + std::to_string(lineno) + ". line='" + line +
                                  "'. Bad character is '" + badChar + "/" +
                                  std::to_string((int)badChar) + "'");
            }
        }

        int i = std::atoi(line.c_str());
        double v = locale_atof(line.c_str());

        switch (state)
        {
        case map_size:
            res.count = i;
            break;
        case first_midi:
            res.firstMidi = i;
            break;
        case last_midi:
            res.lastMidi = i;
            break;
        case middle:
            res.middleNote = i;
            break;
        case reference:
            res.tuningConstantNote = i;
            break;
        case freq:
            res.tuningFrequency = v;
            res.tuningPitch = res.tuningFrequency / 8.17579891564371;
            break;
        case degree:
            res.octaveDegrees = i;
            break;
        case keys:
            res.keys.push_back(i);
            if ((int)res.keys.size() == res.count)
                state = trailing;
            break;
        case trailing:
            break;
        }
        if (!(state == keys || state == trailing))
            state = (parsePosition)(state + 1);
        if (state == keys && res.count == 0)
            state = trailing;
    }

    if (!(state == keys || state == trailing))
    {
        std::ostringstream oss;
        oss << "Incomplete KBM stream. Only able to read " << lineno << " lines. Read up to ";
        switch (state)
        {
        case map_size:
            oss << "map size.";
            break;
        case first_midi:
            oss << "first midi note.";
            break;
        case last_midi:
            oss << "last midi note.";
            break;
        case middle:
            oss << "scale zero note.";
            break;
        case reference:
            oss << "scale reference note.";
            break;
        case freq:
            oss << "scale reference frequency.";
            break;
        case degree:
            oss << "scale degree.";
            break;
        default:
            oss << "unknown state";
            break;
        }
        throw TuningError(oss.str());
    }

    if ((int)res.keys.size() != res.count)
    {
        throw TuningError("Different number of keys than mapping file indicates. Count is " +
                          std::to_string(res.count) + " and we parsed " +
                          std::to_string(res.keys.size()) + " keys.");
    }

    res.rawText = rawOSS.str();
    return res;
}